

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riffcpp.cpp
# Opt level: O3

void __thiscall riffcpp::Chunk::Chunk(Chunk *this,void *buffer,size_t len)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  basic_istream<char,_std::char_traits<char>_> *pbVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  impl *piVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  undefined4 *puVar7;
  uint uVar8;
  char *pcVar9;
  basic_streambuf<char,_std::char_traits<char>_> *__tmp;
  streampos sVar10;
  FourCC read_id;
  undefined1 local_49;
  basic_istream<char,_std::char_traits<char>_> *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  element_type *local_30;
  
  if (buffer == (void *)0x0) {
    puVar7 = (undefined4 *)__cxa_allocate_exception(0x10);
    *puVar7 = 0;
    pcVar9 = "Null buffer";
  }
  else {
    piVar5 = (impl *)operator_new(0x48);
    (piVar5->m_stream).
    super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (piVar5->m_stream).
    super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (piVar5->m_buf).
    super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (piVar5->m_buf).
    super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (piVar5->m_pos)._M_off = 0;
    (piVar5->m_pos)._M_state.__count = 0;
    (piVar5->m_pos)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
    (piVar5->m_limit)._M_off = 0;
    (piVar5->m_limit)._M_state.__count = 0;
    (piVar5->m_limit)._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
    piVar5->m_id = (_Type)0x0;
    piVar5->m_size = 0;
    this->pimpl = piVar5;
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x68);
    p_Var6->_M_use_count = 1;
    p_Var6->_M_weak_count = 1;
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00108c70;
    p_Var6[1]._vptr__Sp_counted_base = (_func_int **)std::ostream::_M_insert<unsigned_long>;
    p_Var6[1]._M_use_count = 0;
    p_Var6[1]._M_weak_count = 0;
    p_Var6[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var6[2]._M_use_count = 0;
    p_Var6[2]._M_weak_count = 0;
    p_Var6[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var6[3]._M_use_count = 0;
    p_Var6[3]._M_weak_count = 0;
    p_Var6[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    std::locale::locale((locale *)&p_Var6[4]._M_use_count);
    p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR__streambuf_00108d10;
    p_Var6[5]._vptr__Sp_counted_base = (_func_int **)buffer;
    *(void **)&p_Var6[5]._M_use_count = buffer;
    p_Var6[6]._vptr__Sp_counted_base = (_func_int **)len;
    piVar5 = this->pimpl;
    (piVar5->m_buf).
    super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)(p_Var6 + 1);
    p_Var1 = (piVar5->m_buf).
             super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (piVar5->m_buf).
    super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var6;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    local_30 = (this->pimpl->m_buf).
               super___shared_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    local_48 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<std::istream,std::allocator<std::istream>,std::streambuf*>
              (a_Stack_40,&local_48,
               (allocator<std::basic_istream<char,_std::char_traits<char>_>_> *)&local_49,&local_30)
    ;
    _Var4._M_pi = a_Stack_40[0]._M_pi;
    pbVar3 = local_48;
    piVar5 = this->pimpl;
    local_48 = (basic_istream<char,_std::char_traits<char>_> *)0x0;
    a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (piVar5->m_stream).
             super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    (piVar5->m_stream).
    super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = pbVar3;
    (piVar5->m_stream).
    super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var4._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
    }
    sVar10 = (streampos)std::istream::tellg();
    this->pimpl->m_pos = sVar10;
    std::istream::seekg((long)(this->pimpl->m_stream).
                              super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,_S_beg);
    sVar10 = (streampos)std::istream::tellg();
    this->pimpl->m_limit = sVar10;
    piVar5 = this->pimpl;
    peVar2 = (piVar5->m_stream).
             super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    p_Var1 = (piVar5->m_stream).
             super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
        piVar5 = this->pimpl;
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    std::istream::seekg(peVar2,(piVar5->m_pos)._M_off,(piVar5->m_pos)._M_state);
    std::istream::read((char *)peVar2,(long)&local_48);
    *(uint *)(this->pimpl->m_id)._M_elems = (uint)local_48;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    piVar5 = this->pimpl;
    peVar2 = (piVar5->m_stream).
             super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    p_Var1 = (piVar5->m_stream).
             super___shared_ptr<std::basic_istream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        UNLOCK();
        piVar5 = this->pimpl;
      }
      else {
        p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      }
    }
    std::istream::seekg(peVar2,(piVar5->m_pos)._M_off + 4,(piVar5->m_pos)._M_state);
    std::istream::read((char *)peVar2,(long)&local_48);
    piVar5 = this->pimpl;
    piVar5->m_size = (uint)local_48;
    uVar8 = (uint)local_48;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      piVar5 = this->pimpl;
      uVar8 = piVar5->m_size;
    }
    if ((long)((ulong)uVar8 + (piVar5->m_pos)._M_off) <= (piVar5->m_limit)._M_off) {
      return;
    }
    puVar7 = (undefined4 *)__cxa_allocate_exception(0x10);
    *puVar7 = 2;
    pcVar9 = "Chunk size outside of range";
  }
  *(char **)(puVar7 + 2) = pcVar9;
  __cxa_throw(puVar7,&Error::typeinfo,0);
}

Assistant:

riffcpp::Chunk::Chunk(const void *buffer, std::size_t len) {
  if (buffer == nullptr) {
    throw Error("Null buffer", ErrorType::NullBuffer);
  }

  pimpl = new riffcpp::Chunk::impl();

  const char *charbuf = static_cast<const char *>(buffer);

  pimpl->m_buf = std::make_shared<membuffer>(const_cast<char *>(charbuf), len);
  pimpl->m_stream = std::make_shared<std::istream>(pimpl->m_buf.get());
  pimpl->m_pos = pimpl->m_stream->tellg();
  pimpl->m_stream->seekg(0, std::ios::end);
  pimpl->m_limit = pimpl->m_stream->tellg();

  pimpl->m_id = read_id(pimpl->m_stream, pimpl->m_pos);
  pimpl->m_size = read_size(pimpl->m_stream, pimpl->m_pos);

  if (pimpl->m_pos + std::streamoff{pimpl->m_size} > pimpl->m_limit) {
    throw Error("Chunk size outside of range", ErrorType::InvalidFile);
  }
}